

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void link_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req->fs_type == UV_FS_LINK) {
    if (req->result == 0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
    pcVar2 = "req->result == 0";
    uVar1 = 0xc4;
  }
  else {
    pcVar2 = "req->fs_type == UV_FS_LINK";
    uVar1 = 0xc3;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar1,pcVar2);
  abort();
}

Assistant:

static void link_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_LINK);
  ASSERT(req->result == 0);
  link_cb_count++;
  uv_fs_req_cleanup(req);
}